

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int32 pare_tree(node *sroot,int32 npermute,int32 **lists,int32 *llist)

{
  node *pnVar1;
  node_str *pnVar2;
  uint uVar3;
  int iVar4;
  node **idlist;
  void *ptr;
  int *ptr_00;
  float *ptr_01;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t n_elem;
  float fVar9;
  
  idlist = (node **)__ckd_calloc__(0x400,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x20e);
  uVar7 = 0;
  uVar3 = id_nodes(sroot,idlist,0);
  n_elem = (size_t)(int)uVar3;
  ptr = __ckd_calloc__(n_elem,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x213);
  ptr_00 = (int *)__ckd_calloc__(n_elem,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x214);
  ptr_01 = (float *)__ckd_calloc__(n_elem,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x215);
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar7;
  }
  iVar4 = 0;
  uVar3 = 0;
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    pnVar1 = idlist[uVar7];
    if (pnVar1 != (node *)0x0) {
      pnVar2 = pnVar1->left;
      if (pnVar2 == (node_str *)0x0) {
        if (pnVar1->right == (node_str *)0x0) {
          lVar6 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          *(int *)((long)ptr + lVar6 * 4) = (int)uVar7;
        }
      }
      else if ((((pnVar2->left == (node_str *)0x0) && (pnVar2->right == (node_str *)0x0)) &&
               (pnVar2 = pnVar1->right, pnVar2 != (node_str *)0x0)) &&
              ((pnVar2->left == (node_str *)0x0 && (pnVar2->right == (node_str *)0x0)))) {
        ptr_00[iVar4] = (int)uVar7;
        ptr_01[iVar4] = (float)pnVar1->lkhd_dec;
        iVar4 = iVar4 + 1;
      }
    }
  }
  while (npermute < (int)uVar3) {
    fVar9 = *ptr_01;
    iVar5 = *ptr_00;
    for (lVar6 = 1; lVar6 < iVar4; lVar6 = lVar6 + 1) {
      if (fVar9 < ptr_01[lVar6]) {
        iVar5 = ptr_00[lVar6];
        fVar9 = ptr_01[lVar6];
      }
    }
    idlist[idlist[iVar5]->left->id] = (node *)0x0;
    idlist[idlist[iVar5]->right->id] = (node *)0x0;
    free_tree(idlist[iVar5]->left);
    free_tree(idlist[iVar5]->right);
    idlist[iVar5]->right = (node_str *)0x0;
    idlist[iVar5]->left = (node_str *)0x0;
    iVar4 = 0;
    uVar3 = 0;
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pnVar1 = idlist[uVar7];
      if (pnVar1 != (node *)0x0) {
        pnVar2 = pnVar1->left;
        if (pnVar2 == (node_str *)0x0) {
          if (pnVar1->right == (node_str *)0x0) {
            lVar6 = (long)(int)uVar3;
            uVar3 = uVar3 + 1;
            *(int *)((long)ptr + lVar6 * 4) = (int)uVar7;
          }
        }
        else if (((pnVar2->left == (node_str *)0x0) && (pnVar2->right == (node_str *)0x0)) &&
                ((pnVar2 = pnVar1->right, pnVar2 != (node_str *)0x0 &&
                 ((pnVar2->left == (node_str *)0x0 && (pnVar2->right == (node_str *)0x0)))))) {
          ptr_00[iVar4] = (int)uVar7;
          ptr_01[iVar4] = (float)pnVar1->lkhd_dec;
          iVar4 = iVar4 + 1;
        }
      }
    }
  }
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    iVar4 = idlist[*(int *)((long)ptr + uVar7 * 4)]->nphones;
    llist[uVar7] = iVar4;
    memcpy(lists[uVar7],idlist[*(int *)((long)ptr + uVar7 * 4)]->phoneids,(long)iVar4 << 2);
  }
  ckd_free(idlist);
  ckd_free(ptr);
  ckd_free(ptr_00);
  ckd_free(ptr_01);
  return uVar3;
}

Assistant:

int32 pare_tree(node *sroot, int32 npermute, int32 **lists, int32 *llist)
{
    float32 *twiglkhddec,maxdec;
    int32  *leaflist, nleaves, *twiglist, ntwigs;
    int32  nnodes,i,maxid;
    node   **idlist;

    /* Overallocate idlist */
    idlist = (node **) ckd_calloc(1024,sizeof(node *));
    /* First "id" all the nodes */
    nnodes = id_nodes(sroot,idlist,0);

    /* Allocate lists (overallocate for safety margin) */
    leaflist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglkhddec = (float32 *) ckd_calloc(nnodes,sizeof(float32));

    nleaves = ntwigs = 0;
    for(i=0;i<nnodes;i++) {
        if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
        else if (IS_TWIG(idlist[i])) {
            twiglist[ntwigs] = i;
            twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
        }
    }

    while (nleaves > npermute) {
        /* find twig for which likelihood decerase was maximum 
         * this is the worst merge */
        maxdec = twiglkhddec[0]; maxid = twiglist[0];
        for (i=1; i<ntwigs;i++) {
            if (twiglkhddec[i] > maxdec) {
                maxdec = twiglkhddec[i];
                maxid = twiglist[i];
            }
        }
        /* remove children of twig, make twig a leaf, eliminate if from
           the node list, and continue */
        idlist[idlist[maxid]->left->id] = NULL;
        idlist[idlist[maxid]->right->id] = NULL;
        free_tree(idlist[maxid]->left); free_tree(idlist[maxid]->right);
        idlist[maxid]->left = idlist[maxid]->right = NULL;

        nleaves = ntwigs = 0;
        for(i=0;i<nnodes;i++) {
            if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
            else if (IS_TWIG(idlist[i])) {
                twiglist[ntwigs] = i;
                twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
            }
        }
    }
    for (i=0;i<nleaves;i++) {
        llist[i] = idlist[leaflist[i]]->nphones;
        memcpy(lists[i],idlist[leaflist[i]]->phoneids,sizeof(int32)*llist[i]);
    }
    ckd_free(idlist); ckd_free(leaflist);
    ckd_free(twiglist); ckd_free(twiglkhddec);

    return(nleaves);
}